

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IncDecVerify.cpp
# Opt level: O0

void incdec_verify::PreIncTestInt8(void)

{
  bool bVar1;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *pSVar2;
  SafeIntException *anon_var_0;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> vv;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  bool fSuccess;
  size_t i;
  allocator local_49;
  string local_48 [43];
  char local_1d;
  undefined1 in_stack_ffffffffffffffee;
  char in_stack_ffffffffffffffef;
  undefined5 in_stack_fffffffffffffff0;
  char cVar3;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_fffffffffffffff6;
  byte bVar4;
  ulong local_8;
  
  for (local_8 = 0; local_8 < 9; local_8 = local_8 + 1) {
    bVar4 = 1;
    pSVar2 = (SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
              *)&stack0xfffffffffffffff6;
    SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt(pSVar2,inc_int8 + local_8 * 3);
    pSVar2 = SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
             ::operator++(pSVar2);
    local_1d = pSVar2->m_int;
    cVar3 = local_1d;
    bVar1 = operator!=((SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        )0x0,'\0');
    if (bVar1) {
      bVar4 = 0;
    }
    if ((bVar4 & 1) != (inc_int8[local_8 * 3 + 2] & 1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_48,"Error in case inc_int8 throw (1): ",&local_49);
      err_msg<signed_char>
                ((string *)
                 CONCAT17(bVar4,CONCAT16(in_stack_fffffffffffffff6.m_int,
                                         CONCAT15(cVar3,in_stack_fffffffffffffff0))),
                 in_stack_ffffffffffffffef,(bool)in_stack_ffffffffffffffee);
      std::__cxx11::string::~string(local_48);
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
    }
  }
  return;
}

Assistant:

void PreIncTestInt8()
{
	size_t i;

	for( i = 0; i < COUNTOF(inc_int8); ++i )
	{
		bool fSuccess = true;
		try
		{
			SafeInt< std::int8_t > si(inc_int8[i].x);
			SafeInt< std::int8_t > vv = ++si;

			if(vv != inc_int8[i].y)
			{
				fSuccess = false;
			}
		}
		catch(SafeIntException&)
		{
			fSuccess = false;
		}

		if( fSuccess != inc_int8[i].fExpected )
		{
			err_msg( "Error in case inc_int8 throw (1): ", inc_int8[i].x, inc_int8[i].fExpected );
		}
	}
}